

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wthelper.h
# Opt level: O3

void __thiscall
WriterTestHelper<unsigned_char,_4U,_32856U>::resize
          (WriterTestHelper<unsigned_char,_4U,_32856U> *this,createFlags flags,ktx_uint32_t layers,
          ktx_uint32_t faces,ktx_uint32_t dimensions,ktx_uint32_t w,ktx_uint32_t h,ktx_uint32_t d,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *requestedColor)

{
  ktxHashList *ppkVar1;
  vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
  *this_00;
  pointer pwVar2;
  byte bVar3;
  ktx_uint32_t i;
  long lVar4;
  size_type __new_size;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  ktx_uint32_t kVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ktxHashListEntry *pWriter;
  uint local_94;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  ulong local_68;
  ulong local_60;
  WriterTestHelper<unsigned_char,_4U,_32856U> *local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  undefined8 local_38;
  
  if (d != 1 && faces != 1) {
    __assert_fail("faces == 1 || d == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/wthelper.h"
                  ,0x53,
                  "void WriterTestHelper<unsigned char, 4, 32856>::resize(createFlags, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, std::vector<component_type> *) [component_type = unsigned char, numComponents = 4, internalformat = 32856]"
                 );
  }
  if ((requestedColor != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) &&
     ((ulong)((long)(requestedColor->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(requestedColor->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start) < 4)) {
    __assert_fail("requestedColor == nullptr || requestedColor->size() >= numComponents",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/wthelper.h"
                  ,0x54,
                  "void WriterTestHelper<unsigned char, 4, 32856>::resize(createFlags, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, std::vector<component_type> *) [component_type = unsigned char, numComponents = 4, internalformat = 32856]"
                 );
  }
  this->width = w;
  this->height = h;
  this->depth = d;
  uVar8 = 1;
  if ((flags & 1) != 0) {
    kVar12 = h;
    if (h < w) {
      kVar12 = w;
    }
    uVar8 = 1;
    if (kVar12 <= d) {
      kVar12 = d;
    }
    for (; kVar12 != 1; kVar12 = kVar12 >> 1) {
      uVar8 = uVar8 + 1;
    }
  }
  this->numLevels = uVar8;
  this->numLayers = layers;
  this->numFaces = faces;
  bVar11 = SUB41((flags & 4) >> 2,0);
  this->isArray = bVar11;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.numLayers = layers;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.numFaces = faces;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.numLevels = uVar8;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.numDimensions = dimensions;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.generateMipmaps = false;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.isArray = bVar11;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.baseWidth = w;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.baseHeight = h;
  (this->texinfo).super_wthTexInfo.super_ktxTextureCreateInfo.baseDepth = d;
  (this->texinfo).super_wthTexInfo.headerNumLayers = (int)(flags << 0x1d) >> 0x1f & layers;
  if (dimensions < 2) {
    h = 0;
  }
  (this->texinfo).super_wthTexInfo.headerPixelHeight = h;
  if (dimensions != 3) {
    d = 0;
  }
  (this->texinfo).super_wthTexInfo.headerPixelDepth = d;
  this->imageDataSize = 0;
  this_00 = &this->images;
  std::
  vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
  ::resize(this_00,(ulong)uVar8);
  std::vector<wthImageInfo,_std::allocator<wthImageInfo>_>::resize
            (&this->imageList,
             (ulong)(this->numLayers * this->numLevels * this->numFaces * this->depth));
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_88,4);
  if (requestedColor != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    lVar4 = 0;
    do {
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4] =
           (requestedColor->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_start[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
  }
  if (this->numLevels != 0) {
    __new_size = (size_type)this->numLayers;
    uVar14 = 0;
    local_94 = 0;
    local_58 = this;
    do {
      bVar3 = (byte)uVar14;
      uVar9 = this->width >> (bVar3 & 0x1f);
      uVar15 = this->height >> (bVar3 & 0x1f);
      uVar8 = this->depth >> (bVar3 & 0x1f);
      std::
      vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ::resize((this->images).
               super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar14,__new_size);
      if (this->numLayers == 0) {
        __new_size = 0;
        uVar13 = uVar14;
      }
      else {
        uVar9 = (uVar15 + (uVar15 == 0)) * (uVar9 + (uVar9 == 0));
        local_48 = (ulong)(uVar9 * 4);
        local_50 = (long)(int)(uVar9 * 4);
        lVar4 = *(long *)&(this_00->
                          super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar14].
                          super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        uVar10 = 0;
        local_68 = uVar14;
        do {
          uVar15 = this->numFaces;
          if (this->numFaces != 6) {
            uVar15 = uVar8 + (uVar8 == 0);
          }
          local_40 = (ulong)uVar15;
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::resize((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)(lVar4 + uVar10 * 0x18),local_40);
          lVar5 = *(long *)(*(long *)&(this_00->
                                      super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar14].
                                      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data + uVar10 * 0x18);
          uVar13 = 0;
          local_60 = uVar10;
          do {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       (lVar5 + uVar13 * 0x18),local_48);
            if (requestedColor == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[3] = '\0';
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[2] = (uchar)uVar13;
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[1] = (uchar)local_60;
              *local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start = (uchar)local_68;
            }
            if ((ulong)uVar9 != 0) {
              uVar6 = 0;
              do {
                lVar4 = 0;
                do {
                  *(uchar *)(lVar4 + *(long *)(*(long *)(*(long *)&(this_00->
                                                                                                                                      
                                                  super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar14]
                                                  .
                                                  super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + uVar10 * 0x18)
                                              + uVar13 * 0x18) + (ulong)(uint)((int)uVar6 * 4)) =
                       local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar4];
                  lVar4 = lVar4 + 1;
                } while (lVar4 != 4);
                uVar6 = uVar6 + 1;
              } while (uVar6 != uVar9);
            }
            uVar6 = (ulong)local_94;
            pwVar2 = (local_58->imageList).
                     super__Vector_base<wthImageInfo,_std::allocator<wthImageInfo>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pwVar2[uVar6].size = (GLsizei)local_50;
            local_58->imageDataSize = local_58->imageDataSize + local_50;
            lVar4 = *(long *)&(local_58->images).
                              super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar14].
                              super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            lVar5 = *(long *)(lVar4 + uVar10 * 0x18);
            local_94 = local_94 + 1;
            pwVar2[uVar6].data = *(GLubyte **)(lVar5 + uVar13 * 0x18);
            uVar13 = uVar13 + 1;
          } while (uVar13 != local_40);
          uVar10 = local_60 + 1;
          __new_size = (size_type)local_58->numLayers;
          this = local_58;
          uVar13 = local_68;
        } while (uVar10 < __new_size);
      }
      uVar14 = uVar13 + 1;
    } while (uVar14 < this->numLevels);
  }
  if (dimensions == 1) {
    snprintf(this->orientation,0xf,"S=%c",0x72);
  }
  else if (dimensions == 2) {
    snprintf(this->orientation,0xf,"S=%c,T=%c",0x72,100);
  }
  else if (dimensions == 3) {
    snprintf(this->orientation,0xf,"S=%c,T=%c,R=%c",0x72,100,0x69);
  }
  builtin_strncpy(this->orientation_ktx2,"rdi",4);
  this->orientation_ktx2[dimensions] = '\0';
  ppkVar1 = &this->kvHash;
  ktxHashList_Construct(ppkVar1);
  sVar7 = strlen(this->orientation);
  ktxHashList_AddKVPair(ppkVar1,"KTXorientation",(int)sVar7 + 1,this->orientation);
  ktxHashList_Serialize(ppkVar1,&this->kvDataLen,&this->kvData);
  ppkVar1 = &this->kvHash_ktx2;
  ktxHashList_Construct(ppkVar1);
  ktxHashList_AddKVPair
            (ppkVar1,"KTXwriter",(int)(this->writer_ktx2)._M_string_length,
             (this->writer_ktx2)._M_dataplus._M_p);
  ktxHashList_FindEntry(ppkVar1,"KTXwriter",&local_38);
  appendLibId(ppkVar1,local_38);
  ktxHashList_Serialize(ppkVar1,&this->kvDataLenWriter_ktx2,&this->kvDataWriter_ktx2);
  ktxHashList_AddKVPair(ppkVar1,"KTXorientation",dimensions + 1,this->orientation_ktx2);
  ktxHashList_Sort(ppkVar1);
  ktxHashList_Serialize(ppkVar1,&this->kvDataLenAll_ktx2,&this->kvDataAll_ktx2);
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void resize(createFlags flags,
                ktx_uint32_t layers, ktx_uint32_t faces,
                ktx_uint32_t dimensions,
                ktx_uint32_t w, ktx_uint32_t h, ktx_uint32_t d,
                std::vector<component_type>* requestedColor = nullptr)
    {
        assert(faces == 1 || d == 1);
        assert(requestedColor == nullptr || requestedColor->size() >= numComponents);

        this->width = w;
        this->height = h;
        this->depth = d;
        numLevels = flags & eMipmapped? levelsFromSize(w, h, d): 1;
        this->numLayers = layers;
        this->numFaces=faces;
        isArray = flags & eArray ? true : false;
        texinfo.resize(numLevels, layers, faces, dimensions,
                       isArray, w, h, d);

        // Create the image set.
        imageDataSize = 0;
        images.resize(numLevels);
        imageList.resize(numLevels * numLayers * numFaces * depth);
        std::vector<component_type> color;
        color.resize(numComponents);
        if (requestedColor != nullptr) {
            for (ktx_uint32_t i = 0; i < numComponents; i++) {
                color[i] = (*requestedColor)[i];
            }
        }
        for (ktx_uint32_t level = 0, count = 0; level < numLevels; level++) {
            ktx_uint32_t levelWidth = MAX(1, width >> level);
            ktx_uint32_t levelHeight = MAX(1, height >> level);
            ktx_uint32_t levelDepth = MAX(1, depth >> level);
            images[level].resize(numLayers);
            for (ktx_uint32_t layer = 0; layer < numLayers; layer++) {
                ktx_uint32_t numImages = numFaces == 6 ? numFaces : levelDepth;
                images[level][layer].resize(numImages);
                for (ktx_uint32_t faceSlice = 0; faceSlice < numImages; faceSlice++) {
                    ktx_uint32_t componentCount, pixelCount;
                    pixelCount = levelWidth * levelHeight;
                    componentCount = pixelCount * numComponents;
                    images[level][layer][faceSlice].resize(componentCount);
                    // Using std::vector avoids warnings in the following
                    // switch due to access past the end of the array, if we
                    // were using an array and numComponents < 4.
                    if (requestedColor == nullptr) {
                        switch (numComponents) {
                          case 4:
                            color[3] = (component_type)0.5;
                            FALLTHROUGH;
                          case 3:
                            color[2] = (component_type)faceSlice;
                            FALLTHROUGH;
                          case 2:
                            color[1] = (component_type)layer;
                            FALLTHROUGH;
                          case 1:
                            color[0] = (component_type)level;
                            break;
                        }
                    }
                    for (ktx_uint32_t i = 0; i < pixelCount; i++) {
                        for (ktx_uint32_t j = 0; j < numComponents; j++) {
                            ktx_uint32_t ci = i * numComponents + j;
                            images[level][layer][faceSlice][ci] = color[j];
                        }
                    }
                    imageList[count].size
                         = pixelCount * numComponents * sizeof(component_type);
                    imageDataSize += imageList[count].size;
                    imageList[count++].data
                         = (GLubyte*)images[level][layer][faceSlice].data();
                }
            }
        }

        switch (dimensions) {
          case 1:
            assert(strlen(KTX_ORIENTATION1_FMT) < sizeof(orientation));
            snprintf(orientation, sizeof(orientation), KTX_ORIENTATION1_FMT,
                     'r');
            break;
          case 2:
            assert(strlen(KTX_ORIENTATION2_FMT) < sizeof(orientation));
            snprintf(orientation, sizeof(orientation), KTX_ORIENTATION2_FMT,
                     'r', 'd');
            break;
          case 3:
            assert(strlen(KTX_ORIENTATION3_FMT) < sizeof(orientation));
            snprintf(orientation, sizeof(orientation), KTX_ORIENTATION3_FMT,
                     'r', 'd', 'i');
            break;
        }
        assert(4 <= sizeof(orientation_ktx2));
        orientation_ktx2[0] = 'r';
        orientation_ktx2[1] = 'd';
        orientation_ktx2[2] = 'i';
        orientation_ktx2[3] = 0;
        orientation_ktx2[dimensions] = 0; // Ensure terminating NULL.

        ktxHashList_Construct(&kvHash);
        ktxHashList_AddKVPair(&kvHash, KTX_ORIENTATION_KEY,
                              (unsigned int)strlen(orientation) + 1,
                              orientation);
        ktxHashList_Serialize(&kvHash, &kvDataLen, &kvData);


        ktxHashList_Construct(&kvHash_ktx2);
        ktxHashList_AddKVPair(&kvHash_ktx2, KTX_WRITER_KEY,
                              (ktx_uint32_t)writer_ktx2.size(),
                              writer_ktx2.data());

        // Get the library to add its Id to the writer key so it will be
        // included in the serialized data.
        ktxHashListEntry* pWriter;
        ktxHashList_FindEntry(&kvHash_ktx2, KTX_WRITER_KEY,
                              &pWriter);
        appendLibId(&kvHash_ktx2, pWriter);

        ktxHashList_Serialize(&kvHash_ktx2, &kvDataLenWriter_ktx2, &kvDataWriter_ktx2);
        ktxHashList_AddKVPair(&kvHash_ktx2, KTX_ORIENTATION_KEY,
                              dimensions + 1,
                              orientation_ktx2);
        ktxHashList_Sort(&kvHash_ktx2);
        ktxHashList_Serialize(&kvHash_ktx2, &kvDataLenAll_ktx2, &kvDataAll_ktx2);
    }